

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.hpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderPrimitiveCounter::~GeometryShaderPrimitiveCounter
          (GeometryShaderPrimitiveCounter *this)

{
  GeometryShaderPrimitiveCounter *this_local;
  
  ~GeometryShaderPrimitiveCounter(this);
  operator_delete(this,0x360);
  return;
}

Assistant:

virtual ~GeometryShaderPrimitiveCounter(void)
	{
	}